

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O0

void libdef_func(BuildCtx *ctx,char *p,int arg)

{
  FILE *__stream;
  uint8_t *puVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  bool bVar5;
  char *local_28;
  int local_20;
  int i;
  int arg_local;
  char *p_local;
  BuildCtx *ctx_local;
  
  if (arg != 0) {
    ffasmfunc = ffasmfunc + 1;
  }
  if (ctx->mode == BUILD_libdef) {
    if (modstate == 0) {
      fprintf(_stderr,"Error: no module for function definition %s\n",p);
      exit(1);
    }
    if (regfunc == 1) {
      if (&optr < optr + 1) {
        fprintf(_stderr,"Error: output buffer overflow\n");
        exit(1);
      }
      puVar1 = optr + 1;
      *optr = 0xfe;
      optr = puVar1;
    }
    else {
      if (arg != 0x80) {
        if (modstate != 1) {
          fprintf((FILE *)ctx->fp,",\n");
        }
        modstate = 2;
        pcVar4 = "lj_cf_";
        if (arg != 0) {
          pcVar4 = "lj_ffh_";
        }
        fprintf((FILE *)ctx->fp,"  %s%s",pcVar4,p);
      }
      if (regfunc == 2) {
        local_28 = "";
      }
      else {
        obuf[2] = obuf[2] + '\x01';
        local_28 = p;
      }
      libdef_name(local_28,arg);
    }
  }
  else if (ctx->mode == BUILD_ffdef) {
    fprintf((FILE *)ctx->fp,"FFDEF(%s)\n",p);
  }
  else if (ctx->mode == BUILD_recdef) {
    sVar3 = strlen(p);
    if (0x4f < sVar3) {
      fprintf(_stderr,"Error: function name too long: \'%s\'\n",p);
      exit(1);
    }
    strcpy(funcname,p);
  }
  else if (ctx->mode == BUILD_vmdef) {
    local_20 = 1;
    while( true ) {
      bVar5 = false;
      if (p[local_20] != '\0') {
        bVar5 = modname[local_20 + -1] != '\0';
      }
      if (!bVar5) break;
      if (p[local_20] == '_') {
        p[local_20] = '.';
      }
      local_20 = local_20 + 1;
    }
    fprintf((FILE *)ctx->fp,"\"%s\",\n",p);
  }
  else if ((ctx->mode == BUILD_bcdef) && (arg != 0)) {
    __stream = (FILE *)ctx->fp;
    uVar2 = find_ffofs(ctx,p);
    fprintf(__stream,",\n%d",(ulong)uVar2);
  }
  ffid = ffid + 1;
  regfunc = 0;
  return;
}

Assistant:

static void libdef_func(BuildCtx *ctx, char *p, int arg)
{
  if (arg != LIBINIT_CF)
    ffasmfunc++;
  if (ctx->mode == BUILD_libdef) {
    if (modstate == 0) {
      fprintf(stderr, "Error: no module for function definition %s\n", p);
      exit(1);
    }
    if (regfunc == REGFUNC_NOREG) {
      if (optr+1 > obuf+sizeof(obuf)) {
	fprintf(stderr, "Error: output buffer overflow\n");
	exit(1);
      }
      *optr++ = LIBINIT_FFID;
    } else {
      if (arg != LIBINIT_ASM_) {
	if (modstate != 1) fprintf(ctx->fp, ",\n");
	modstate = 2;
	fprintf(ctx->fp, "  %s%s", arg ? LABEL_PREFIX_FFH : LABEL_PREFIX_CF, p);
      }
      if (regfunc != REGFUNC_NOREGUV) obuf[2]++;  /* Bump hash table size. */
      libdef_name(regfunc == REGFUNC_NOREGUV ? "" : p, arg);
    }
  } else if (ctx->mode == BUILD_ffdef) {
    fprintf(ctx->fp, "FFDEF(%s)\n", p);
  } else if (ctx->mode == BUILD_recdef) {
    if (strlen(p) > sizeof(funcname)-1) {
      fprintf(stderr, "Error: function name too long: '%s'\n", p);
      exit(1);
    }
    strcpy(funcname, p);
  } else if (ctx->mode == BUILD_vmdef) {
    int i;
    for (i = 1; p[i] && modname[i-1]; i++)
      if (p[i] == '_') p[i] = '.';
    fprintf(ctx->fp, "\"%s\",\n", p);
  } else if (ctx->mode == BUILD_bcdef) {
    if (arg != LIBINIT_CF)
      fprintf(ctx->fp, ",\n%d", find_ffofs(ctx, p));
  }
  ffid++;
  regfunc = REGFUNC_OK;
}